

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

void deqp::gles3::Functional::eval_faceForward_vec2(ShaderEvalContext *c)

{
  ulong uVar1;
  int i;
  long lVar2;
  float res;
  float fVar3;
  float local_30 [2];
  Vector<float,_2> res_1;
  ulong local_20;
  ulong local_18 [2];
  int local_8 [2];
  
  local_30[1] = c->in[0].m_data[1];
  local_30[0] = c->in[0].m_data[3];
  uVar1 = *(ulong *)c->in[1].m_data;
  local_18[0] = uVar1 << 0x20 | uVar1 >> 0x20;
  uVar1 = *(ulong *)(c->in[2].m_data + 1);
  local_20 = uVar1 << 0x20 | uVar1 >> 0x20;
  fVar3 = 0.0;
  lVar2 = 0;
  do {
    fVar3 = fVar3 + *(float *)((long)local_18 + lVar2 * 4 + -8) *
                    *(float *)((long)local_18 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  if (0.0 <= fVar3) {
    res_1.m_data[0] = 0.0;
    res_1.m_data[1] = 0.0;
    lVar2 = 0;
    do {
      res_1.m_data[lVar2] = -local_30[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 == 1);
  }
  else {
    res_1.m_data[0] = local_30[0];
    res_1.m_data[1] = local_30[1];
  }
  local_8[0] = 1;
  local_8[1] = 2;
  lVar2 = 0;
  do {
    (c->color).m_data[local_8[lVar2]] = res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 == 1);
  return;
}

Assistant:

Vector<T, 2>			swizzle		(int a, int b) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); return Vector<T, 2>(m_data[a], m_data[b]); }